

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O0

bool tinyusdz::tydra::EvaluateShaderAttribute<std::array<unsigned_int,2ul>>
               (Stage *stage,Shader *shader,string *attr_name,array<unsigned_int,_2UL> *out_val,
               string *err,TimeCode timeCode)

{
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [36];
  undefined4 local_84;
  array<unsigned_int,_2UL> *local_80;
  array<unsigned_int,_2UL> *pt;
  UsdPreviewSurface *local_70;
  UsdPreviewSurface *psurf;
  undefined1 local_60 [7];
  bool result;
  Value outval;
  uint32_t tyid;
  string *err_local;
  array<unsigned_int,_2UL> *out_val_local;
  string *attr_name_local;
  Shader *shader_local;
  Stage *stage_local;
  TimeCode timeCode_local;
  
  if (out_val == (array<unsigned_int,_2UL> *)0x0) {
    timeCode_local.time_._7_1_ = false;
  }
  else {
    outval.v_.vtable._4_4_ = tinyusdz::value::TypeTraits<std::array<unsigned_int,_2UL>_>::type_id();
    tinyusdz::value::Value::Value((Value *)local_60);
    psurf._7_1_ = 0;
    local_70 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&shader->value,false);
    if (local_70 == (UsdPreviewSurface *)0x0) {
      if (err != (string *)0x0) {
        tinyusdz::value::Value::type_name_abi_cxx11_(&local_e8,&shader->value);
        ::std::operator+(&local_c8,"Unsupported shader type: ",&local_e8);
        ::std::operator+(local_a8,(char *)&local_c8);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_a8);
        ::std::__cxx11::string::~string((string *)local_a8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::__cxx11::string::~string((string *)&local_e8);
      }
      timeCode_local.time_._7_1_ = false;
    }
    else {
      pt = (array<unsigned_int,_2UL> *)timeCode.time_;
      psurf._7_1_ = anon_unknown_4::EvaluateUsdPreviewSurfaceAttribute
                              (stage,local_70,attr_name,outval.v_.vtable._4_4_,(Value *)local_60,err
                               ,timeCode);
      local_80 = tinyusdz::value::Value::as<std::array<unsigned_int,2ul>>((Value *)local_60,false);
      if (local_80 == (array<unsigned_int,_2UL> *)0x0) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=((string *)err,"[InternalError] Type mismatch.\n");
        }
        timeCode_local.time_._7_1_ = false;
      }
      else {
        *(undefined8 *)out_val->_M_elems = *(undefined8 *)local_80->_M_elems;
        timeCode_local.time_._7_1_ = (bool)(psurf._7_1_ & 1);
      }
    }
    local_84 = 1;
    tinyusdz::value::Value::~Value((Value *)local_60);
  }
  return timeCode_local.time_._7_1_;
}

Assistant:

bool EvaluateShaderAttribute(
  const Stage &stage,
  const Shader &shader, const std::string &attr_name,
  T * out_val,
  std::string *err,
  const value::TimeCode timeCode) {

  if (!out_val) {
    return false;
  }

  uint32_t tyid = value::TypeTraits<T>::type_id();
  value::Value outval;

  bool result = false;

  if (const auto *psurf = shader.value.as<UsdPreviewSurface>()) {
    result = EvaluateUsdPreviewSurfaceAttribute(stage, *psurf, attr_name, tyid, outval, err, timeCode);
    if (const auto pt = outval.as<T>()) {
      (*out_val) = (*pt);
    } else {
      if (err) {
        (*err) += "[InternalError] Type mismatch.\n";
      }
      return false;
    }
  } else {
    if (err) {
      (*err) += "Unsupported shader type: " + shader.value.type_name() + "\n";
    }
    return false;
  }

  return result;
}